

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed.c
# Opt level: O0

void ed_sub(ed *out,ed *P,ed *Q)

{
  limb_t *in_RDX;
  limb_t *in_RSI;
  fld_t t;
  fld_t h;
  fld_t g;
  fld_t f;
  fld_t e;
  fld_t d;
  fld_t c;
  fld_t b;
  fld_t a;
  limb_t alStackY_1c8 [6];
  limb_t local_198 [6];
  limb_t local_168 [6];
  limb_t local_138 [6];
  limb_t local_108 [6];
  limb_t local_d8;
  limb_t *in_stack_ffffffffffffff30;
  limb_t *in_stack_ffffffffffffff38;
  limb_t *in_stack_ffffffffffffff40;
  limb_t local_a8 [6];
  limb_t local_78 [6];
  limb_t local_48 [6];
  limb_t *local_18;
  limb_t *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  fld_sub(local_48,in_RSI + 5,in_RSI);
  fld_add(alStackY_1c8,local_18 + 5,local_18);
  fld_mul(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  fld_add(local_78,local_10 + 5,local_10);
  fld_sub(alStackY_1c8,local_18 + 5,local_18);
  fld_mul(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  fld_mul(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  fld_mul(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  fld_mul(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  fld_scale2(&local_d8,&local_d8);
  fld_sub(local_108,local_78,local_48);
  fld_sub(local_138,&local_d8,local_a8);
  fld_add(local_168,&local_d8,local_a8);
  fld_add(local_198,local_78,local_48);
  fld_mul(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  fld_mul(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  fld_mul(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  fld_mul(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  return;
}

Assistant:

static void
ed_sub(struct ed *out, const struct ed *P, const struct ed *Q)
{
	fld_t a, b, c, d, e, f, g, h, t;
	
	fld_sub(a, P->y, P->x);
	fld_add(t, Q->y, Q->x);
	fld_mul(a, a, t);

	fld_add(b, P->y, P->x);
	fld_sub(t, Q->y, Q->x);
	fld_mul(b, b, t);

	fld_mul(c, P->t, Q->t);
	fld_mul(c, c, con_m2d);

	fld_mul(d, P->z, Q->z);
	fld_scale2(d, d);

	fld_sub(e, b, a);
	fld_sub(f, d, c);
	fld_add(g, d, c);
	fld_add(h, b, a);
	
	fld_mul(out->x, e, f);
	fld_mul(out->y, g, h);
	fld_mul(out->t, e, h);
	fld_mul(out->z, f, g);
}